

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O1

void __thiscall
amrex::STLtools::fillFab
          (STLtools *this,BaseFab<double> *levelset,Geometry *geom,RunOn param_3,Box *param_4)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  pointer pTVar26;
  double *pdVar27;
  double dVar28;
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  int iVar39;
  pointer pTVar40;
  int iVar41;
  int iVar42;
  XDim3 *pXVar43;
  double dVar44;
  byte bVar45;
  uint uVar46;
  int iVar47;
  long lVar48;
  double *pdVar49;
  double *pdVar50;
  uint uVar51;
  long lVar52;
  bool bVar53;
  undefined4 uVar54;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  Real RVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  Real RVar63;
  double dVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dStack_450;
  double dStack_420;
  double local_238;
  double local_230;
  undefined1 local_228 [16];
  double local_218;
  undefined8 uStack_210;
  double local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [16];
  double local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [16];
  double local_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  ulong uStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  double local_138;
  undefined8 uStack_130;
  undefined1 local_128 [16];
  Real local_118;
  undefined8 uStack_110;
  Real local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  uVar51 = 0xbff00000;
  if (this->m_boundry_is_outside == false) {
    local_230 = 1.0;
  }
  else {
    local_230 = -1.0;
    uVar51 = 0x3ff00000;
  }
  uVar18 = this->m_num_tri;
  dVar1 = (geom->prob_domain).xlo[0];
  dVar2 = (geom->prob_domain).xlo[1];
  dVar3 = (geom->prob_domain).xlo[2];
  dVar4 = (geom->super_CoordSys).dx[0];
  dVar5 = (geom->super_CoordSys).dx[1];
  dVar6 = (geom->super_CoordSys).dx[2];
  pTVar26 = (this->m_tri_pts_d).m_data;
  RVar59 = (this->m_ptmin).x;
  dVar7 = (this->m_ptmin).y;
  dVar8 = (this->m_ptmin).z;
  RVar63 = (this->m_ptmax).x;
  dVar9 = (this->m_ptmax).y;
  dVar10 = (this->m_ptmax).z;
  dVar11 = (this->m_ptref).x;
  dVar12 = (this->m_ptref).y;
  pdVar27 = levelset->dptr;
  iVar19 = (levelset->domain).smallend.vect[0];
  iVar20 = (levelset->domain).smallend.vect[1];
  iVar21 = (levelset->domain).smallend.vect[2];
  iVar22 = (levelset->domain).bigend.vect[0];
  iVar23 = (levelset->domain).bigend.vect[1];
  dVar13 = (this->m_ptref).z;
  local_238 = (double)((ulong)uVar51 << 0x20);
  iVar24 = (levelset->domain).bigend.vect[2];
  if (iVar21 <= iVar24) {
    lVar48 = (long)((iVar22 - iVar19) + 1);
    iVar25 = (levelset->domain).bigend.vect[1];
    local_208 = -dVar12;
    uStack_200 = 0x8000000000000000;
    dVar55 = -dVar13;
    uStack_100 = 0;
    uStack_110 = 0;
    local_118 = RVar63;
    local_108 = RVar59;
    iVar41 = iVar21;
    do {
      if (iVar20 <= iVar25) {
        dVar32 = (double)iVar41 * dVar6 + dVar3;
        local_88 = dVar32;
        if (dVar32 <= dVar13) {
          local_88 = dVar13;
        }
        uStack_80 = 0;
        local_f8 = dVar32;
        if (dVar13 <= dVar32) {
          local_f8 = dVar13;
        }
        uStack_f0 = 0;
        dVar28 = dVar13 - dVar32;
        local_1f8._0_8_ = -dVar32;
        uStack_1e0 = 0x8000000000000000;
        local_1f8._8_4_ = SUB84(dVar32,0);
        local_1f8._12_4_ = (int)((ulong)local_1f8._0_8_ >> 0x20);
        local_228._8_8_ = dVar32;
        local_228._0_8_ = local_1f8._0_8_;
        local_168._8_8_ = 0;
        local_168._0_8_ = dVar28;
        local_178._8_4_ = SUB84(dVar28,0);
        local_178._0_8_ = dVar28;
        local_178._12_4_ = (int)((ulong)dVar28 >> 0x20);
        local_1e8 = local_1f8._0_8_;
        iVar42 = iVar20;
        do {
          if (iVar19 <= iVar22) {
            dVar28 = (double)iVar42 * dVar5 + dVar2;
            local_68 = dVar28;
            if (dVar28 <= dVar12) {
              local_68 = dVar12;
            }
            uStack_60 = 0;
            local_78 = dVar28;
            if (dVar12 <= dVar28) {
              local_78 = dVar12;
            }
            uStack_70 = 0;
            dVar35 = dVar12 * dVar32 + dVar28 * dVar55;
            local_138 = dVar28 - dVar12;
            local_1d8._0_8_ = -dVar28;
            uStack_1c0 = 0x8000000000000000;
            local_1d8._8_4_ = SUB84(dVar28,0);
            local_1d8._12_4_ = (int)((ulong)local_1d8._0_8_ >> 0x20);
            uStack_130 = 0;
            local_148._8_4_ = SUB84(local_138,0);
            local_148._0_8_ = local_138;
            local_148._12_4_ = (int)((ulong)local_138 >> 0x20);
            local_128._8_8_ = 0;
            local_128._0_8_ = dVar35;
            local_158._8_4_ = SUB84(dVar35,0);
            local_158._0_8_ = dVar35;
            local_158._12_4_ = (int)((ulong)dVar35 >> 0x20);
            iVar39 = iVar19;
            local_1c8 = local_1d8._0_8_;
            do {
              dVar35 = (double)iVar39 * dVar4 + dVar1;
              pdVar49 = &local_230;
              if (((((dVar7 <= dVar28 && dVar28 <= dVar9) && dVar8 <= dVar32) && dVar32 <= dVar10)
                  && 0 < (int)uVar18) && (RVar59 <= dVar35 && dVar35 <= RVar63)) {
                local_48 = dVar35;
                if (dVar35 <= dVar11) {
                  local_48 = dVar11;
                }
                uStack_40 = 0;
                local_58 = dVar35;
                if (dVar11 <= dVar35) {
                  local_58 = dVar11;
                }
                uStack_50 = 0;
                local_d8 = dVar11 * dVar28 + dVar35 * local_208;
                dVar68 = dVar11 * dVar32 + dVar35 * dVar55;
                local_c8 = dVar11 - dVar35;
                uStack_b0 = 0;
                uStack_90 = 0;
                local_a8._8_8_ = 0;
                local_a8._0_8_ = dVar68;
                local_e8._8_4_ = SUB84(dVar68,0);
                local_e8._0_8_ = dVar68;
                local_e8._12_4_ = (int)((ulong)dVar68 >> 0x20);
                lVar52 = 0;
                uVar51 = 0;
                dStack_d0 = local_d8;
                dStack_c0 = local_c8;
                local_b8 = local_c8;
                local_98 = local_d8;
                do {
                  dVar68 = *(double *)((long)&(pTVar26->v1).x + lVar52);
                  dVar14 = *(double *)((long)&(pTVar26->v2).x + lVar52);
                  dVar61 = *(double *)((long)&(pTVar26->v3).x + lVar52);
                  uVar54 = SUB84(dVar14,0);
                  uVar65 = (int)((ulong)dVar14 >> 0x20);
                  if (dVar68 <= dVar14) {
                    uVar54 = SUB84(dVar68,0);
                    uVar65 = (int)((ulong)dVar68 >> 0x20);
                  }
                  dVar57 = dVar61;
                  if ((double)CONCAT44(uVar65,uVar54) <= dVar61) {
                    dVar57 = (double)CONCAT44(uVar65,uVar54);
                  }
                  iVar47 = 0;
                  if (dVar57 <= local_48) {
                    pTVar40 = (pointer)&pTVar26->v2;
                    if (dVar14 <= dVar68) {
                      pTVar40 = pTVar26;
                    }
                    pdVar49 = (double *)((long)&(pTVar40->v1).x + lVar52);
                    if (*pdVar49 <= dVar61 && dVar61 != *pdVar49) {
                      pdVar49 = (double *)((long)&(pTVar26->v3).x + lVar52);
                    }
                    iVar47 = 0;
                    if (local_58 < *pdVar49 || local_58 == *pdVar49) {
                      dVar57 = *(double *)((long)&(pTVar26->v1).y + lVar52);
                      dVar62 = *(double *)((long)&(pTVar26->v2).y + lVar52);
                      dVar15 = *(double *)((long)&(pTVar26->v3).y + lVar52);
                      uVar54 = SUB84(dVar62,0);
                      uVar65 = (int)((ulong)dVar62 >> 0x20);
                      if (dVar57 <= dVar62) {
                        uVar54 = SUB84(dVar57,0);
                        uVar65 = (int)((ulong)dVar57 >> 0x20);
                      }
                      dVar16 = dVar15;
                      if ((double)CONCAT44(uVar65,uVar54) <= dVar15) {
                        dVar16 = (double)CONCAT44(uVar65,uVar54);
                      }
                      if (dVar16 <= local_68) {
                        pXVar43 = &pTVar26->v2;
                        if (dVar62 <= dVar57) {
                          pXVar43 = &pTVar26->v1;
                        }
                        pdVar49 = (double *)((long)&pXVar43->y + lVar52);
                        if (*pdVar49 <= dVar15 && dVar15 != *pdVar49) {
                          pdVar49 = (double *)((long)&(pTVar26->v3).y + lVar52);
                        }
                        iVar47 = 0;
                        if (local_78 < *pdVar49 || local_78 == *pdVar49) {
                          dVar16 = *(double *)((long)&(pTVar26->v1).z + lVar52);
                          dVar69 = *(double *)((long)&(pTVar26->v2).z + lVar52);
                          dVar17 = *(double *)((long)&(pTVar26->v3).z + lVar52);
                          uVar54 = SUB84(dVar69,0);
                          uVar65 = (int)((ulong)dVar69 >> 0x20);
                          if (dVar16 <= dVar69) {
                            uVar54 = SUB84(dVar16,0);
                            uVar65 = (int)((ulong)dVar16 >> 0x20);
                          }
                          dVar67 = dVar17;
                          if ((double)CONCAT44(uVar65,uVar54) <= dVar17) {
                            dVar67 = (double)CONCAT44(uVar65,uVar54);
                          }
                          if (dVar67 <= local_88) {
                            pXVar43 = &pTVar26->v2;
                            if (dVar69 <= dVar16) {
                              pXVar43 = &pTVar26->v1;
                            }
                            pdVar50 = (double *)((long)&pXVar43->z + lVar52);
                            pdVar49 = (double *)((long)&(pTVar26->v3).z + lVar52);
                            if (*pdVar50 <= dVar17 && dVar17 != *pdVar50) {
                              pdVar50 = pdVar49;
                            }
                            iVar47 = 0;
                            if (local_f8 < *pdVar50 || local_f8 == *pdVar50) {
                              auVar29._8_4_ = SUB84(dVar14 - dVar61,0);
                              auVar29._0_8_ = dVar68 - dVar14;
                              auVar29._12_4_ = (int)((ulong)(dVar14 - dVar61) >> 0x20);
                              dVar30 = dVar69 - dVar17;
                              dVar36 = dVar62 - dVar57;
                              dVar37 = dVar15 - dVar62;
                              uVar54 = (undefined4)((ulong)dVar37 >> 0x20);
                              dVar74 = dVar61 * dVar57 - dVar68 * dVar15;
                              dVar67 = dVar61 * dVar16 - dVar68 * dVar17;
                              dVar58 = dVar15 * dVar16 - dVar57 * dVar17;
                              dVar77 = dVar17 - dVar16;
                              dVar75 = dVar57 - dVar15;
                              dVar56 = dVar14 * dVar15 - dVar61 * dVar62;
                              dVar64 = dVar14 * dVar17 - dVar61 * dVar69;
                              dVar60 = dVar17 * dVar62 - dVar15 * dVar69;
                              auVar34._8_4_ = SUB84(dVar37,0);
                              auVar34._0_8_ = dVar36;
                              auVar34._12_4_ = uVar54;
                              dStack_420 = auVar29._8_8_;
                              dVar71 = (double)local_148._0_8_ * (dVar68 * dVar69 - dVar14 * dVar16)
                                       + (double)local_178._0_8_ *
                                         (dVar68 * dVar62 - dVar14 * dVar57) +
                                         (double)local_158._0_8_ * (dVar68 - dVar14) +
                                         local_c8 * (dVar69 * dVar57 - dVar62 * dVar16) +
                                         local_d8 * (dVar16 - dVar69) +
                                         (double)local_e8._0_8_ * dVar36;
                              dVar72 = (double)local_148._8_8_ * dVar64 +
                                       (double)local_178._8_8_ * dVar56 +
                                       (double)local_158._8_8_ * dStack_420 +
                                       dStack_c0 * dVar60 +
                                       dStack_d0 * dVar30 + (double)local_e8._8_8_ * dVar37;
                              dVar70 = dVar61 - dVar68;
                              dVar76 = local_138 * dVar67 +
                                       (double)local_168._0_8_ * dVar74 +
                                       (double)local_128._0_8_ * dVar70 +
                                       local_b8 * dVar58 +
                                       local_98 * dVar77 + (double)local_a8._0_8_ * dVar75;
                              auVar38._8_8_ = -(ulong)(ABS(dVar72) < 2.220446049250313e-16);
                              auVar38._0_8_ = -(ulong)(ABS(dVar71) < 2.220446049250313e-16);
                              uVar46 = movmskpd((int)pdVar49,auVar38);
                              dVar73 = ABS(dVar76);
                              bVar45 = (byte)uVar46;
                              dStack_450 = auVar34._8_8_;
                              dVar44 = dStack_450;
                              if ((((uVar46 & 1) == 0) ||
                                  (iVar47 = CONCAT31((int3)(uVar46 >> 8),bVar45 >> 1),
                                  bVar45 >> 1 == 0)) || (2.220446049250313e-16 <= dVar73)) {
                                dVar61 = -dVar16;
                                if (((0.0 <= dVar76) || (0.0 <= dVar71)) || (0.0 <= dVar72)) {
                                  auVar33._8_4_ = (int)-(ulong)(0.0 < dVar72);
                                  auVar33._0_8_ = -(ulong)(0.0 < dVar71);
                                  auVar33._12_4_ = (int)(-(ulong)(0.0 < dVar72) >> 0x20);
                                  iVar47 = movmskpd(iVar47,auVar33);
                                  if ((((0.0 < dVar76) && (iVar47 == 3)) ||
                                      (((bVar45 & 0.0 < dVar72 * dVar76) != 0 ||
                                       ((ABS(dVar72) < 2.220446049250313e-16 &&
                                        (0.0 < dVar76 * dVar71)))))) ||
                                     ((dVar73 < 2.220446049250313e-16 && (0.0 < dVar72 * dVar71))))
                                  goto LAB_00681ca9;
                                  if ((2.220446049250313e-16 <= ABS(dVar72)) ||
                                     (2.220446049250313e-16 <= dVar73 && (uVar46 & 1) == 0)) {
                                    iVar47 = 0;
                                    if ((~bVar45 & 1) == 0 && dVar73 < 2.220446049250313e-16) {
                                      if (0.0 < (dVar75 * (dVar35 * dVar69 +
                                                          dVar14 * (double)local_1f8._8_8_) +
                                                dVar77 * (dVar35 * dVar62 +
                                                         (double)local_1d8._8_8_ * dVar14) +
                                                dVar58 * (dVar35 - dVar14) +
                                                dVar70 * (dVar28 * dVar69 +
                                                         (double)local_1f8._8_8_ * dVar62) +
                                                dVar74 * ((double)local_228._8_8_ - dVar69) +
                                                dVar67 * (dVar62 - dVar28)) *
                                                (dVar75 * (dVar14 * dVar13 + dVar11 * -dVar69) +
                                                dVar77 * (dVar14 * dVar12 + -dVar62 * dVar11) +
                                                dVar58 * (dVar14 - dVar11) +
                                                dVar70 * (dVar62 * dVar13 + -dVar69 * dVar12) +
                                                dVar74 * (dVar69 - dVar13) +
                                                dVar67 * (dVar12 - dVar62))) goto LAB_006824bc;
                                    }
                                    goto LAB_006824c1;
                                  }
                                  dVar68 = (dStack_450 * (dVar35 * dVar16 + dVar68 * local_1e8) +
                                           dVar30 * (dVar35 * dVar57 + local_1c8 * dVar68) +
                                           dVar60 * (dVar35 - dVar68) +
                                           dStack_420 * (dVar28 * dVar16 + local_1e8 * dVar57) +
                                           dVar56 * ((double)local_228._8_8_ - dVar16) +
                                           dVar64 * (dVar57 - dVar28)) *
                                           (dStack_450 * (dVar68 * dVar13 + dVar11 * dVar61) +
                                           dVar30 * (dVar68 * dVar12 + -dVar57 * dVar11) +
                                           dVar60 * (dVar68 - dVar11) +
                                           dStack_420 * (dVar57 * dVar13 + dVar61 * dVar12) +
                                           dVar56 * (dVar16 - dVar13) + dVar64 * (dVar12 - dVar57));
                                }
                                else {
LAB_00681ca9:
                                  dVar68 = (dStack_450 * (dVar11 * dVar16 + dVar68 * dVar55) +
                                           dVar30 * (dVar11 * dVar57 + local_208 * dVar68) +
                                           dVar60 * (dVar11 - dVar68) +
                                           dStack_420 * (dVar12 * dVar16 + dVar55 * dVar57) +
                                           dVar56 * (dVar13 - dVar16) + dVar64 * (dVar57 - dVar12))
                                           * (dStack_450 * (dVar68 * dVar32 + dVar35 * dVar61) +
                                             dVar30 * (dVar68 * dVar28 + -dVar57 * dVar35) +
                                             dVar60 * (dVar68 - dVar35) +
                                             dStack_420 * (dVar57 * dVar32 + dVar61 * dVar28) +
                                             dVar56 * (dVar16 - dVar32) + dVar64 * (dVar28 - dVar57)
                                             );
                                }
                                iVar47 = 0;
                                if (dVar68 <= 0.0) goto LAB_006824c1;
                              }
                              else {
                                dVar30 = dVar14 - dVar68;
                                dVar60 = dVar69 - dVar16;
                                dVar56 = dVar36 * dVar77 - (dVar15 - dVar57) * dVar60;
                                dVar58 = dVar60 * dVar70 - dVar77 * dVar30;
                                dVar67 = (dVar15 - dVar57) * dVar30 - dVar70 * dVar36;
                                dVar67 = dVar67 * dVar67 + dVar56 * dVar56 + dVar58 * dVar58;
                                if (dVar67 < 0.0) {
                                  dVar67 = sqrt(dVar67);
                                }
                                else {
                                  dVar67 = SQRT(dVar67);
                                }
                                dVar64 = dVar36 * (dVar13 - dVar16) + (dVar12 - dVar57) * -dVar60;
                                dVar58 = dVar60 * (dVar11 - dVar68) + (dVar13 - dVar16) * -dVar30;
                                dVar56 = (dVar11 - dVar68) * -dVar36 + dVar30 * (dVar12 - dVar57);
                                dVar56 = dVar56 * dVar56 + dVar64 * dVar64 + dVar58 * dVar58;
                                if (dVar56 < 0.0) {
                                  dVar56 = sqrt(dVar56);
                                  uVar65 = extraout_XMM0_Dc;
                                  uVar66 = extraout_XMM0_Dd;
                                }
                                else {
                                  uVar65 = 0;
                                  uVar66 = 0;
                                  dVar56 = SQRT(dVar56);
                                }
                                dVar71 = dVar61 - dVar14;
                                dVar58 = dVar17 - dVar69;
                                dVar70 = dStack_450 * (dVar13 - dVar69) - (dVar12 - dVar62) * dVar58
                                ;
                                dVar64 = dVar58 * (dVar11 - dVar14) - (dVar13 - dVar69) * dVar71;
                                auVar31._8_4_ = SUB84(dVar37,0);
                                auVar31._0_8_ = dStack_450;
                                auVar31._12_4_ = uVar54;
                                dVar37 = dVar71 * (dVar12 - dVar62) - (dVar11 - dVar14) * dStack_450
                                ;
                                dVar37 = dVar37 * dVar37 + dVar70 * dVar70 + dVar64 * dVar64;
                                local_188._8_4_ = uVar65;
                                local_188._0_8_ = dVar56 * 0.5;
                                local_188._12_4_ = uVar66;
                                if (dVar37 < 0.0) {
                                  dVar37 = sqrt(dVar37);
                                }
                                else {
                                  dVar37 = SQRT(dVar37);
                                }
                                dVar72 = dVar68 - dVar61;
                                local_218 = dVar16 - dVar17;
                                dVar70 = dVar75 * (dVar13 - dVar17) - (dVar12 - dVar15) * local_218;
                                uStack_210 = 0;
                                dVar64 = local_218 * (dVar11 - dVar61) - (dVar13 - dVar17) * dVar72;
                                dVar56 = dVar72 * (dVar12 - dVar15) - (dVar11 - dVar61) * dVar75;
                                local_198 = -dVar58;
                                uStack_190 = 0x8000000000000000;
                                local_1a8 = -dVar71;
                                uStack_1a0 = 0x8000000000000000;
                                dVar56 = dVar56 * dVar56 + dVar70 * dVar70 + dVar64 * dVar64;
                                dStack_450 = auVar31._8_8_;
                                local_1b8 = -dVar44;
                                uStack_1b0 = (ulong)dStack_450 ^ 0x8000000000000000;
                                if (dVar56 < 0.0) {
                                  dVar56 = sqrt(dVar56);
                                }
                                else {
                                  dVar56 = SQRT(dVar56);
                                }
                                dVar64 = dVar36 * (dVar32 - dVar16) + -dVar60 * (dVar28 - dVar57);
                                dVar16 = dVar60 * (dVar35 - dVar68) + (dVar32 - dVar16) * -dVar30;
                                dVar68 = dVar30 * (dVar28 - dVar57) + (dVar35 - dVar68) * -dVar36;
                                dVar57 = -local_218;
                                dVar68 = dVar68 * dVar68 + dVar64 * dVar64 + dVar16 * dVar16;
                                if (dVar68 < 0.0) {
                                  dVar68 = sqrt(dVar68);
                                }
                                else {
                                  dVar68 = SQRT(dVar68);
                                }
                                dVar16 = dVar44 * (dVar32 - dVar69) + local_198 * (dVar28 - dVar62);
                                dVar69 = dVar58 * (dVar35 - dVar14) + (dVar32 - dVar69) * local_1a8;
                                dVar14 = dVar71 * (dVar28 - dVar62) + (dVar35 - dVar14) * local_1b8;
                                dVar14 = dVar14 * dVar14 + dVar16 * dVar16 + dVar69 * dVar69;
                                if (dVar14 < 0.0) {
                                  dVar14 = sqrt(dVar14);
                                }
                                else {
                                  dVar14 = SQRT(dVar14);
                                }
                                dVar62 = dVar75 * (dVar32 - dVar17) + dVar57 * (dVar28 - dVar15);
                                dVar57 = local_218 * (dVar35 - dVar61) + (dVar32 - dVar17) * -dVar72
                                ;
                                dVar61 = dVar72 * (dVar28 - dVar15) + (dVar35 - dVar61) * -dVar75;
                                dVar61 = dVar61 * dVar61 + dVar62 * dVar62 + dVar57 * dVar57;
                                if (dVar61 < 0.0) {
                                  dVar61 = sqrt(dVar61);
                                }
                                else {
                                  dVar61 = SQRT(dVar61);
                                }
                                if ((ABS(((double)local_188._0_8_ + dVar37 * 0.5 + dVar56 * 0.5) -
                                         dVar67 * 0.5) <= 2.220446049250313e-16) &&
                                   (iVar47 = 0,
                                   ABS((dVar68 * 0.5 + dVar14 * 0.5 + dVar61 * 0.5) - dVar67 * 0.5)
                                   <= 2.220446049250313e-16)) goto LAB_006824c1;
                              }
LAB_006824bc:
                              iVar47 = 1;
                            }
                          }
                        }
                      }
                    }
                  }
LAB_006824c1:
                  uVar51 = uVar51 + iVar47;
                  lVar52 = lVar52 + 0x48;
                } while ((ulong)uVar18 * 0x48 != lVar52);
                pdVar49 = &local_238;
                RVar59 = local_108;
                RVar63 = local_118;
                if ((uVar51 & 1) == 0) {
                  pdVar49 = &local_230;
                }
              }
              pdVar27[(long)(iVar41 - iVar21) * ((iVar23 - iVar20) + 1) * lVar48 +
                      (iVar42 - iVar20) * lVar48 + (long)(iVar39 - iVar19)] = *pdVar49;
              bVar53 = iVar39 != iVar22;
              iVar39 = iVar39 + 1;
            } while (bVar53);
          }
          bVar53 = iVar42 != iVar25;
          iVar42 = iVar42 + 1;
        } while (bVar53);
      }
      bVar53 = iVar41 != iVar24;
      iVar41 = iVar41 + 1;
    } while (bVar53);
  }
  return;
}

Assistant:

void
STLtools::fillFab (BaseFab<Real>& levelset, const Geometry& geom, RunOn, Box const&) const
{
    int num_triangles = m_num_tri;

    const auto plo = geom.ProbLoArray();
    const auto dx  = geom.CellSizeArray();

    const Triangle* tri_pts = m_tri_pts_d.data();
    XDim3 ptmin = m_ptmin;
    XDim3 ptmax = m_ptmax;
    XDim3 ptref = m_ptref;
    Real reference_value = m_boundry_is_outside ? -1.0_rt :  1.0_rt;
    Real other_value     = m_boundry_is_outside ?  1.0_rt : -1.0_rt;

    auto const& a = levelset.array();
    const Box& bx = levelset.box();
    ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        Real coords[3];
        coords[0]=plo[0]+i*dx[0];
        coords[1]=plo[1]+j*dx[1];
#if (AMREX_SPACEDIM == 2)
        coords[2]=Real(0.);
#else
        coords[2]=plo[2]+k*dx[2];
#endif
        int num_intersects=0;
        if (coords[0] >= ptmin.x && coords[0] <= ptmax.x &&
            coords[1] >= ptmin.y && coords[1] <= ptmax.y &&
            coords[2] >= ptmin.z && coords[2] <= ptmax.z)
        {
            Real pr[]={ptref.x, ptref.y, ptref.z};
            for (int tr=0; tr < num_triangles; ++tr) {
                if (line_tri_intersects(pr, coords, tri_pts[tr])) {
                    ++num_intersects;
                }
            }
        }
        a(i,j,k) = (num_intersects % 2 == 0) ? reference_value : other_value;
    });
}